

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall node::calc(node *this,int id,double X,double Y,double Z)

{
  double dVar1;
  vec3 *pvVar2;
  __type _Var3;
  double dVar4;
  double dVar5;
  undefined8 local_ac;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a4;
  double local_a0;
  double height;
  double N;
  double sin_latitude;
  double longitude;
  double latitude;
  double cos_theta;
  double sin_theta;
  double eDashSquared;
  double theta;
  double p;
  double _eccentricitySquared;
  double f;
  double _radiusPolar;
  double _radiusEquator;
  double Z_local;
  double Y_local;
  double X_local;
  node *pnStack_10;
  int id_local;
  node *this_local;
  
  _radiusPolar = 6378137.0;
  f = 6356752.3142;
  _eccentricitySquared = 0.0033528106647474805;
  _radiusEquator = Z;
  Z_local = Y;
  Y_local = X;
  X_local._4_4_ = id;
  pnStack_10 = this;
  _Var3 = std::pow<double,int>(0.0033528106647474805,2);
  p = -_Var3 + 0.006705621329494961;
  theta = sqrt(Y_local * Y_local + Z_local * Z_local);
  eDashSquared = atan2(_radiusEquator * _radiusPolar,theta * f);
  sin_theta = (_radiusPolar * _radiusPolar + -(f * f)) / (f * f);
  cos_theta = sin(eDashSquared);
  latitude = cos(eDashSquared);
  longitude = atan((sin_theta * f * cos_theta * cos_theta * cos_theta + _radiusEquator) /
                   (-(p * _radiusPolar * latitude * latitude) * latitude + theta));
  sin_latitude = atan2(Z_local,Y_local);
  N = sin(longitude);
  dVar5 = _radiusPolar;
  dVar4 = sqrt(-(p * N) * N + 1.0);
  dVar1 = theta;
  height = dVar5 / dVar4;
  dVar5 = cos(longitude);
  local_a0 = dVar1 / dVar5 - height;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_ac,sin_latitude,longitude,local_a0);
  pvVar2 = points_wgs84 + this->id;
  pvVar2->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_ac;
  pvVar2->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_ac._4_4_;
  pvVar2->field_2 = local_a4;
  return;
}

Assistant:

void node::calc(int id, double X, double Y, double Z){
    double _radiusEquator = 6378137;
    double _radiusPolar =  6356752.3142;
    double f = 1/298.257223563;
    double _eccentricitySquared = 2*f - pow(f,2);
    double p = sqrt(X*X + Y*Y);

    double theta = atan2(Z*_radiusEquator , (p*_radiusPolar));

    double eDashSquared = (_radiusEquator*_radiusEquator - _radiusPolar*_radiusPolar)/
                          (_radiusPolar*_radiusPolar);


    double sin_theta = sin(theta);

    double cos_theta = cos(theta);


    double latitude = atan( (Z + eDashSquared*_radiusPolar*sin_theta*sin_theta*sin_theta) /
                            (p - _eccentricitySquared*_radiusEquator*cos_theta*cos_theta*cos_theta) );

    double longitude = atan2(Y,X);


    double sin_latitude = sin(latitude);

    double N = _radiusEquator / sqrt( 1.0 - _eccentricitySquared*sin_latitude*sin_latitude);


    double height = p/cos(latitude) - N;
//    points->replace(id,QVector3D(latitude,longitude,height));
    //DoSomething
    points_wgs84[this->id] = glm::vec3(longitude,latitude,height);
}